

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O0

int32_t utrie2_internalU8NextIndex_63(UTrie2 *trie,UChar32 c,uint8_t *src,uint8_t *limit)

{
  int32_t iVar1;
  int32_t local_30;
  int32_t local_2c;
  int32_t length;
  int32_t i;
  uint8_t *limit_local;
  uint8_t *src_local;
  UTrie2 *pUStack_10;
  UChar32 c_local;
  UTrie2 *trie_local;
  
  local_2c = 0;
  if ((long)limit - (long)src < 8) {
    local_30 = (int)limit - (int)src;
  }
  else {
    local_30 = 7;
  }
  _length = limit;
  limit_local = src;
  src_local._4_4_ = c;
  pUStack_10 = trie;
  src_local._4_4_ = utf8_nextCharSafeBody_63(src,&local_2c,local_30,c,-1);
  iVar1 = u8Index(pUStack_10,src_local._4_4_,local_2c);
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie2_internalU8NextIndex(const UTrie2 *trie, UChar32 c,
                           const uint8_t *src, const uint8_t *limit) {
    int32_t i, length;
    i=0;
    /* support 64-bit pointers by avoiding cast of arbitrary difference */
    if((limit-src)<=7) {
        length=(int32_t)(limit-src);
    } else {
        length=7;
    }
    c=utf8_nextCharSafeBody(src, &i, length, c, -1);
    return u8Index(trie, c, i);
}